

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O3

void mxx::
     global_scan<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,mxx::min<int>>
               (int *begin,int *end,int *out,undefined1 param_4,comm *param_5)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  int *piVar6;
  T sum;
  comm nonzero_comm;
  undefined4 local_4c;
  comm local_48;
  
  comm::split(&local_48,param_5,(uint)((long)end - (long)begin != 0));
  if ((long)end - (long)begin != 0) {
    iVar1 = *begin;
    *out = iVar1;
    piVar6 = begin + 1;
    if (piVar6 != end) {
      piVar4 = out + 1;
      do {
        if (*piVar6 < iVar1) {
          iVar1 = *piVar6;
        }
        *piVar4 = iVar1;
        piVar6 = piVar6 + 1;
        piVar4 = piVar4 + 1;
      } while (piVar6 != end);
    }
    local_4c = *(undefined4 *)((long)out + ((long)end - (long)begin) + -4);
    iVar1 = exscan<int,mxx::min<int>>(&local_4c,&local_48,param_4);
    if (local_48.m_rank != 0) {
      lVar5 = (long)end - (long)begin >> 2;
      lVar2 = 0;
      do {
        iVar3 = out[lVar2];
        if (iVar1 <= out[lVar2]) {
          iVar3 = iVar1;
        }
        out[lVar2] = iVar3;
        lVar2 = lVar2 + 1;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar2);
    }
  }
  comm::~comm(&local_48);
  return;
}

Assistant:

void global_scan(InIterator begin, InIterator end, OutIterator out, Func func, const bool commutative, const mxx::comm& comm = mxx::comm()) {
    OutIterator o = out;
    size_t n = std::distance(begin, end);
    // create subcommunicator for those processes which contain elements
    mxx::comm nonzero_comm = comm.split(n > 0);
    if (n > 0) {
        // local scan
        local_scan(begin, end, out, func);
        // mxx::scan
        typedef typename std::iterator_traits<OutIterator>::value_type T;
        T sum = *(out+(n-1));
        T presum = exscan(sum, func, nonzero_comm, commutative);
        if (nonzero_comm.rank() != 0) {
            // accumulate previous sum on all local elements
            for (size_t i = 0; i < n; ++i) {
                *o = func(presum, *o);
                ++o;
            }
        }
    }
}